

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O1

bool __thiscall storage::BTree::_insert_(BTree *this,int key,Record *record)

{
  int iVar1;
  BTInnerNode *this_00;
  BTLeafNode *pBVar2;
  BTLeafNode *this_01;
  BTNode *pBVar3;
  BTLeafNode *pBVar4;
  bool err;
  int newk;
  BTNode *node;
  bool local_45;
  int local_44;
  BTLeafNode *local_40;
  Record *local_38;
  
  pBVar2 = (BTLeafNode *)this->root_;
  if (pBVar2 == (BTLeafNode *)0x0) {
    pBVar3 = (BTNode *)operator_new(0x278);
    pBVar3->parent_ = (BTNode *)0x0;
    pBVar3->child_index_ = -1;
    pBVar3->used_links_count_ = 0;
    pBVar3->_vptr_BTNode = (_func_int **)&PTR_is_leaf_node_00109d70;
    memset(pBVar3 + 1,0,0x198);
    this->root_ = pBVar3;
    pBVar3->used_links_count_ = 2;
    pBVar3->keys_[0] = key;
    pBVar3[1]._vptr_BTNode = (_func_int **)record;
    pBVar3[2].keys_[0x27] = 0;
    pBVar3[2].keys_[0x28] = 0;
    local_38._0_1_ = 1;
  }
  else {
    local_40 = pBVar2;
    local_38 = record;
    iVar1 = (**(pBVar2->super_BTNode)._vptr_BTNode)(pBVar2);
    if ((char)iVar1 == '\0') {
      do {
        this_00 = (BTInnerNode *)__dynamic_cast(pBVar2,&BTNode::typeinfo,&BTInnerNode::typeinfo,0);
        BTInnerNode::search_node(this_00,key,(BTNode **)&local_40);
        pBVar2 = local_40;
        iVar1 = (**(local_40->super_BTNode)._vptr_BTNode)(local_40);
      } while ((char)iVar1 == '\0');
    }
    local_45 = false;
    iVar1 = 0;
    pBVar2 = (BTLeafNode *)__dynamic_cast(pBVar2,&BTNode::typeinfo,&BTLeafNode::typeinfo,0);
    pBVar2 = BTLeafNode::insert_(pBVar2,key,local_38,&local_45);
    local_38 = (Record *)CONCAT71(local_38._1_7_,local_45);
    if (local_45 == true) {
      if (pBVar2 != (BTLeafNode *)0x0) {
        iVar1 = (pBVar2->super_BTNode).keys_[0];
      }
      do {
        pBVar4 = local_40;
        if (pBVar2 == (BTLeafNode *)0x0) break;
        pBVar3 = (local_40->super_BTNode).parent_;
        if (pBVar3 == (BTNode *)0x0) {
          this_01 = (BTLeafNode *)0x0;
        }
        else {
          this_01 = (BTLeafNode *)__dynamic_cast(pBVar3,&BTNode::typeinfo,&BTInnerNode::typeinfo,0);
        }
        if (this_01 == (BTLeafNode *)0x0) {
          pBVar3 = (BTNode *)operator_new(0x278);
          pBVar3->parent_ = (BTNode *)0x0;
          pBVar3->child_index_ = -1;
          pBVar3->used_links_count_ = 0;
          pBVar3->_vptr_BTNode = (_func_int **)&PTR_is_leaf_node_00109db0;
          memset(pBVar3 + 1,0,0x198);
          pBVar3->used_links_count_ = 2;
          pBVar3->keys_[0] = iVar1;
          if ((pBVar4->super_BTNode).keys_[0] < (pBVar2->super_BTNode).keys_[0]) {
            pBVar3[1]._vptr_BTNode = (_func_int **)pBVar4;
            (pBVar4->super_BTNode).parent_ = pBVar3;
            (pBVar4->super_BTNode).child_index_ = 0;
            pBVar3[1].parent_ = &pBVar2->super_BTNode;
            pBVar4 = pBVar2;
          }
          else {
            pBVar3[1]._vptr_BTNode = (_func_int **)pBVar2;
            (pBVar2->super_BTNode).parent_ = pBVar3;
            (pBVar2->super_BTNode).child_index_ = 0;
            pBVar3[1].parent_ = &pBVar4->super_BTNode;
          }
          (pBVar4->super_BTNode).parent_ = pBVar3;
          (pBVar4->super_BTNode).child_index_ = 1;
          this->root_ = pBVar3;
        }
        else {
          local_44 = 0;
          pBVar2 = (BTLeafNode *)
                   BTInnerNode::insert_
                             ((BTInnerNode *)this_01,iVar1,&pBVar2->super_BTNode,&local_44);
          iVar1 = local_44;
          local_40 = this_01;
        }
      } while (this_01 != (BTLeafNode *)0x0);
    }
  }
  return (bool)local_38._0_1_;
}

Assistant:

bool BTree::_insert_(int key, Record *record) {
        if (!root_) {
            auto t = new BTLeafNode;
            root_ = t;
            t->used_links_count_ = 2;
            t->keys_[0] = key;
            t->record_links_[0] = record;
            t->next_ = nullptr;
            return true;
        }
        BTNode *node = root_;
        while (!node->is_leaf_node()) {
            dynamic_cast<BTInnerNode *>(node)->search_node(key, node);
        }
        bool err = false;
        BTNode *M = dynamic_cast<BTLeafNode *>(node)->insert_(key, record, err);
        if (!err) return false; // exists

        int kk = 0;
        if (M) kk = M->keys_[0];
        while (M) {
            BTInnerNode *parent = dynamic_cast<BTInnerNode *>(node->parent_);
            if (!parent) {
                BTInnerNode *rt = new BTInnerNode;
                rt->used_links_count_ = 2;
                rt->keys_[0] = kk;
                if (node->keys_[0] < M->keys_[0]) {
                    rt->set_link(0, node);//rt->links_[0] = node;
                    rt->set_link(1, M);//rt->links_[1] = M;
                } else {
                    rt->set_link(0, M);//rt->links_[0] = M;
                    rt->set_link(1, node);//rt->links_[1] = node;
                }
                root_ = rt;
                rt->resolve_brother();
                break;
            } else {
                int newk = 0;
                M = parent->insert_(kk, M, newk);
                kk = newk;
                node = parent;
            }
        }
        return true;
    }